

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void initScene(scene_t *scene)

{
  yo_shape *pyVar1;
  float *pfVar2;
  int iVar3;
  data_t dVar4;
  undefined8 *puVar5;
  void *__dest;
  char *vp;
  char *fp;
  long lVar6;
  string local_310 [32];
  string local_2f0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d0 [32];
  __cxx11 local_2b0 [32];
  __cxx11 local_290 [32];
  string local_270 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190 [8];
  string vert_head;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170 [32];
  int local_150;
  allocator local_149;
  int i_2;
  string N_ZEROS;
  char *pcStack_128;
  char *attribs [6];
  uchar *buffer;
  int local_dc;
  int j;
  yo_shape *shape;
  int i_1;
  int n;
  size_t LHSize;
  size_t sphcntSize;
  size_t clusteridsSize;
  size_t objidsSize;
  size_t normalsSize;
  size_t texcoordsSize;
  size_t positionsSize;
  float *LH;
  int *sphcnt;
  int *clusterids;
  int *objids;
  m_vec3 *normals;
  m_vec2 *texcoords;
  m_vec3 *positions;
  yo_scene *pyStack_50;
  int i;
  yo_scene *yo;
  undefined1 local_38 [8];
  SphereTree hierarchy;
  scene_t *scene_local;
  
  hierarchy.child.super__Vector_base<SphereTree,_std::allocator<SphereTree>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)scene;
  load_sphere_hierarchy((SphereTree *)local_38,"../res/scene1/scene1.sph");
  buildLHcubemap("../res/null.shrgb");
  loadlut(3,(float *)((long)&((hierarchy.child.
                               super__Vector_base<SphereTree,_std::allocator<SphereTree>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage)->child).
                             super__Vector_base<SphereTree,_std::allocator<SphereTree>_>._M_impl.
                             super__Vector_impl_data._M_finish + 4));
  build_sh_lut();
  iVar3 = upload_gamma(0xf);
  *(int *)&((hierarchy.child.super__Vector_base<SphereTree,_std::allocator<SphereTree>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage)->child).
           super__Vector_base<SphereTree,_std::allocator<SphereTree>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage = iVar3;
  iVar3 = upload_sqrgamma(0xf);
  *(int *)((long)&((hierarchy.child.super__Vector_base<SphereTree,_std::allocator<SphereTree>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage)->child).
                  super__Vector_base<SphereTree,_std::allocator<SphereTree>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage + 4) = iVar3;
  github111116::ConsoleLogger::log<char[12],int>
            (&console,(char (*) [12])0x239b43,
             (int *)&((hierarchy.child.super__Vector_base<SphereTree,_std::allocator<SphereTree>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage)->child).
                     super__Vector_base<SphereTree,_std::allocator<SphereTree>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage);
  github111116::ConsoleLogger::log<char[15],int>
            (&console,(char (*) [15])"sqrgamma size:",
             (int *)((long)&((hierarchy.child.
                              super__Vector_base<SphereTree,_std::allocator<SphereTree>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage)->child).
                            super__Vector_base<SphereTree,_std::allocator<SphereTree>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage + 4));
  github111116::ConsoleLogger::log<char[17]>(&console,(char (*) [17])"loading scene...");
  pyStack_50 = yo_load_obj("../res/scene1/scene1.obj",true,false);
  if ((pyStack_50 == (yo_scene *)0x0) || (pyStack_50->nshapes == 0)) {
    puVar5 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar5 = "Error loading obj file";
    __cxa_throw(puVar5,&char_const*::typeinfo,0);
  }
  github111116::ConsoleLogger::log<int,char[7]>
            (&console,&pyStack_50->nshapes,(char (*) [7])"shapes");
  *(undefined4 *)
   &((hierarchy.child.super__Vector_base<SphereTree,_std::allocator<SphereTree>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage)->child).
    super__Vector_base<SphereTree,_std::allocator<SphereTree>_>._M_impl.super__Vector_impl_data.
    _M_finish = 0;
  for (positions._4_4_ = 0; positions._4_4_ < pyStack_50->nshapes;
      positions._4_4_ = positions._4_4_ + 1) {
    *(int *)&((hierarchy.child.super__Vector_base<SphereTree,_std::allocator<SphereTree>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage)->child).
             super__Vector_base<SphereTree,_std::allocator<SphereTree>_>._M_impl.
             super__Vector_impl_data._M_finish =
         pyStack_50->shapes[positions._4_4_].nelems * 3 +
         *(int *)&((hierarchy.child.super__Vector_base<SphereTree,_std::allocator<SphereTree>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage)->child).
                  super__Vector_base<SphereTree,_std::allocator<SphereTree>_>._M_impl.
                  super__Vector_impl_data._M_finish;
  }
  upload_albedo_map(pyStack_50->nshapes,(string *)texture_file_abi_cxx11_);
  texcoords = (m_vec2 *)
              calloc((long)*(int *)&((hierarchy.child.
                                      super__Vector_base<SphereTree,_std::allocator<SphereTree>_>.
                                      _M_impl.super__Vector_impl_data._M_end_of_storage)->child).
                                    super__Vector_base<SphereTree,_std::allocator<SphereTree>_>.
                                    _M_impl.super__Vector_impl_data._M_finish,0xc);
  normals = (m_vec3 *)
            calloc((long)*(int *)&((hierarchy.child.
                                    super__Vector_base<SphereTree,_std::allocator<SphereTree>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage)->child).
                                  super__Vector_base<SphereTree,_std::allocator<SphereTree>_>.
                                  _M_impl.super__Vector_impl_data._M_finish,8);
  objids = (int *)calloc((long)*(int *)&((hierarchy.child.
                                          super__Vector_base<SphereTree,_std::allocator<SphereTree>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage)->child
                                        ).
                                        super__Vector_base<SphereTree,_std::allocator<SphereTree>_>.
                                        _M_impl.super__Vector_impl_data._M_finish,0xc);
  clusterids = (int *)calloc((long)*(int *)&((hierarchy.child.
                                              super__Vector_base<SphereTree,_std::allocator<SphereTree>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                            child).
                                            super__Vector_base<SphereTree,_std::allocator<SphereTree>_>
                                            ._M_impl.super__Vector_impl_data._M_finish,4);
  sphcnt = (int *)calloc((long)*(int *)&((hierarchy.child.
                                          super__Vector_base<SphereTree,_std::allocator<SphereTree>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage)->child
                                        ).
                                        super__Vector_base<SphereTree,_std::allocator<SphereTree>_>.
                                        _M_impl.super__Vector_impl_data._M_finish,4);
  LH = (float *)calloc((long)*(int *)&((hierarchy.child.
                                        super__Vector_base<SphereTree,_std::allocator<SphereTree>_>.
                                        _M_impl.super__Vector_impl_data._M_end_of_storage)->child).
                                      super__Vector_base<SphereTree,_std::allocator<SphereTree>_>.
                                      _M_impl.super__Vector_impl_data._M_finish,4);
  positionsSize =
       (size_t)calloc((long)*(int *)&((hierarchy.child.
                                       super__Vector_base<SphereTree,_std::allocator<SphereTree>_>.
                                       _M_impl.super__Vector_impl_data._M_end_of_storage)->child).
                                     super__Vector_base<SphereTree,_std::allocator<SphereTree>_>.
                                     _M_impl.super__Vector_impl_data._M_finish,900);
  texcoordsSize =
       (long)*(int *)&((hierarchy.child.super__Vector_base<SphereTree,_std::allocator<SphereTree>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage)->child).
                      super__Vector_base<SphereTree,_std::allocator<SphereTree>_>._M_impl.
                      super__Vector_impl_data._M_finish * 0xc;
  normalsSize = (long)*(int *)&((hierarchy.child.
                                 super__Vector_base<SphereTree,_std::allocator<SphereTree>_>._M_impl
                                 .super__Vector_impl_data._M_end_of_storage)->child).
                               super__Vector_base<SphereTree,_std::allocator<SphereTree>_>._M_impl.
                               super__Vector_impl_data._M_finish << 3;
  objidsSize = (long)*(int *)&((hierarchy.child.
                                super__Vector_base<SphereTree,_std::allocator<SphereTree>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage)->child).
                              super__Vector_base<SphereTree,_std::allocator<SphereTree>_>._M_impl.
                              super__Vector_impl_data._M_finish * 0xc;
  clusteridsSize =
       (long)*(int *)&((hierarchy.child.super__Vector_base<SphereTree,_std::allocator<SphereTree>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage)->child).
                      super__Vector_base<SphereTree,_std::allocator<SphereTree>_>._M_impl.
                      super__Vector_impl_data._M_finish << 2;
  sphcntSize = (long)*(int *)&((hierarchy.child.
                                super__Vector_base<SphereTree,_std::allocator<SphereTree>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage)->child).
                              super__Vector_base<SphereTree,_std::allocator<SphereTree>_>._M_impl.
                              super__Vector_impl_data._M_finish << 2;
  LHSize = (long)*(int *)&((hierarchy.child.
                            super__Vector_base<SphereTree,_std::allocator<SphereTree>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage)->child).
                          super__Vector_base<SphereTree,_std::allocator<SphereTree>_>._M_impl.
                          super__Vector_impl_data._M_finish << 2;
  _i_1 = (long)(*(int *)&((hierarchy.child.
                           super__Vector_base<SphereTree,_std::allocator<SphereTree>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage)->child).
                         super__Vector_base<SphereTree,_std::allocator<SphereTree>_>._M_impl.
                         super__Vector_impl_data._M_finish * 0xe1) << 2;
  shape._4_4_ = 0;
  for (shape._0_4_ = 0; iVar3 = (int)shape, (int)shape < pyStack_50->nshapes;
      shape._0_4_ = (int)shape + 1) {
    pyVar1 = pyStack_50->shapes;
    if (((enable_texture[(int)shape] & 1U) != 0) && (pyVar1[(int)shape].texcoord == (float *)0x0)) {
      github111116::ConsoleLogger::error<char[6],int,char[39]>
                (&console,(char (*) [6])"Shape",(int *)&shape,
                 (char (*) [39])"is texture-enabled but has no texcoord");
    }
    for (local_dc = 0;
        SBORROW4(local_dc,pyVar1[iVar3].nelems * 3) != local_dc + pyVar1[iVar3].nelems * -3 < 0;
        local_dc = local_dc + 1) {
      pfVar2 = pyVar1[iVar3].pos;
      lVar6 = (long)(pyVar1[iVar3].elem[local_dc] * 3);
      puVar5 = (undefined8 *)((long)texcoords + (long)(shape._4_4_ + local_dc) * 0xc);
      *puVar5 = *(undefined8 *)(pfVar2 + lVar6);
      *(float *)(puVar5 + 1) = pfVar2[lVar6 + 2];
      pfVar2 = pyVar1[iVar3].norm;
      lVar6 = (long)(pyVar1[iVar3].elem[local_dc] * 3);
      *(undefined8 *)(objids + (long)(shape._4_4_ + local_dc) * 3) = *(undefined8 *)(pfVar2 + lVar6)
      ;
      (objids + (long)(shape._4_4_ + local_dc) * 3)[2] = (int)pfVar2[lVar6 + 2];
      if ((enable_texture[(int)shape] & 1U) == 0) {
        *(undefined8 *)(&normals->x + (long)(shape._4_4_ + local_dc) * 2) = 0xbf800000bf800000;
      }
      else {
        *(undefined8 *)(&normals->x + (long)(shape._4_4_ + local_dc) * 2) =
             *(undefined8 *)(pyVar1[iVar3].texcoord + (pyVar1[iVar3].elem[local_dc] << 1));
      }
      clusterids[shape._4_4_ + local_dc] = (int)shape;
    }
    shape._4_4_ = pyVar1[iVar3].nelems * 3 + shape._4_4_;
  }
  yo_free_scene(pyStack_50);
  cluster_points(*(int *)&((hierarchy.child.
                            super__Vector_base<SphereTree,_std::allocator<SphereTree>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage)->child).
                          super__Vector_base<SphereTree,_std::allocator<SphereTree>_>._M_impl.
                          super__Vector_impl_data._M_finish,(vec3f *)texcoords,sphcnt);
  cluster_preprocess(*(int *)&((hierarchy.child.
                                super__Vector_base<SphereTree,_std::allocator<SphereTree>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage)->child).
                              super__Vector_base<SphereTree,_std::allocator<SphereTree>_>._M_impl.
                              super__Vector_impl_data._M_finish,(vec3f *)texcoords,sphcnt,
                     (SphereTree *)local_38,(int *)LH);
  calculateLH(*(int *)&((hierarchy.child.super__Vector_base<SphereTree,_std::allocator<SphereTree>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage)->child).
                       super__Vector_base<SphereTree,_std::allocator<SphereTree>_>._M_impl.
                       super__Vector_impl_data._M_finish,(vec3f *)texcoords,(vec3f *)objids,
              (float *)positionsSize,"../res/scene1/light7.obj");
  uploadLH(*(int *)&((hierarchy.child.super__Vector_base<SphereTree,_std::allocator<SphereTree>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage)->child).
                    super__Vector_base<SphereTree,_std::allocator<SphereTree>_>._M_impl.
                    super__Vector_impl_data._M_finish,(float *)positionsSize);
  github111116::ConsoleLogger::log<char[25]>(&console,(char (*) [25])"renderer initializing...");
  (*glad_glGenVertexArrays)
            (1,(GLuint *)
               &(hierarchy.child.super__Vector_base<SphereTree,_std::allocator<SphereTree>_>._M_impl
                 .super__Vector_impl_data._M_end_of_storage)->child);
  (*glad_glBindVertexArray)
            (*(GLuint *)
              &((hierarchy.child.super__Vector_base<SphereTree,_std::allocator<SphereTree>_>._M_impl
                 .super__Vector_impl_data._M_end_of_storage)->child).
               super__Vector_base<SphereTree,_std::allocator<SphereTree>_>._M_impl.
               super__Vector_impl_data._M_start);
  (*glad_glGenBuffers)
            (1,(GLuint *)
               ((long)&((hierarchy.child.super__Vector_base<SphereTree,_std::allocator<SphereTree>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage)->child).
                       super__Vector_base<SphereTree,_std::allocator<SphereTree>_>._M_impl.
                       super__Vector_impl_data._M_start + 4));
  (*glad_glBindBuffer)
            (0x8892,*(GLuint *)
                     ((long)&((hierarchy.child.
                               super__Vector_base<SphereTree,_std::allocator<SphereTree>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage)->child).
                             super__Vector_base<SphereTree,_std::allocator<SphereTree>_>._M_impl.
                             super__Vector_impl_data._M_start + 4));
  (*glad_glBufferData)
            (0x8892,texcoordsSize + normalsSize + objidsSize + clusteridsSize + sphcntSize + LHSize,
             (void *)0x0,0x88e4);
  __dest = (*glad_glMapBuffer)(0x8892,0x88b9);
  if (__dest != (void *)0x0) {
    memcpy(__dest,texcoords,texcoordsSize);
    memcpy((void *)((long)__dest + texcoordsSize),normals,normalsSize);
    memcpy((void *)((long)__dest + normalsSize + texcoordsSize),objids,objidsSize);
    memcpy((void *)((long)__dest + objidsSize + normalsSize + texcoordsSize),clusterids,
           clusteridsSize);
    memcpy((void *)((long)__dest + clusteridsSize + objidsSize + normalsSize + texcoordsSize),sphcnt
           ,sphcntSize);
    memcpy((void *)((long)__dest +
                   sphcntSize + clusteridsSize + objidsSize + normalsSize + texcoordsSize),LH,LHSize
          );
    (*glad_glUnmapBuffer)(0x8892);
    (*glad_glEnableVertexAttribArray)(0);
    (*glad_glVertexAttribPointer)(0,3,0x1406,'\0',0,(void *)0x0);
    (*glad_glEnableVertexAttribArray)(1);
    (*glad_glVertexAttribPointer)(1,2,0x1406,'\0',0,(void *)texcoordsSize);
    (*glad_glEnableVertexAttribArray)(2);
    (*glad_glVertexAttribPointer)(2,3,0x1406,'\0',0,(void *)(texcoordsSize + normalsSize));
    (*glad_glEnableVertexAttribArray)(3);
    (*glad_glVertexAttribIPointer)(3,1,0x1404,0,(void *)(texcoordsSize + normalsSize + objidsSize));
    (*glad_glEnableVertexAttribArray)(4);
    (*glad_glVertexAttribIPointer)
              (4,1,0x1404,0,(void *)(texcoordsSize + normalsSize + objidsSize + clusteridsSize));
    (*glad_glEnableVertexAttribArray)(5);
    (*glad_glVertexAttribIPointer)
              (5,1,0x1404,0,
               (void *)(texcoordsSize + normalsSize + objidsSize + clusteridsSize + sphcntSize));
    free(texcoords);
    free(objids);
    free(clusterids);
    free(sphcnt);
    free(LH);
    free((void *)positionsSize);
    attribs[3] = "a_clusterid";
    attribs[4] = "a_sphcnt";
    attribs[1] = "a_normal";
    attribs[2] = "a_objid";
    pcStack_128 = "a_position";
    attribs[0] = "a_texcoord";
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&i_2,"0",&local_149);
    std::allocator<char>::~allocator((allocator<char> *)&local_149);
    for (local_150 = 1; local_150 < 0xe1; local_150 = local_150 + 1) {
      std::operator+(local_170,(char *)&i_2);
      std::__cxx11::string::operator=((string *)&i_2,(string *)local_170);
      std::__cxx11::string::~string((string *)local_170);
    }
    std::__cxx11::to_string(local_290,0xf);
    std::operator+((char *)local_270,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   "#version 410 core\n#define sh_order ");
    std::operator+(local_250,(char *)local_270);
    std::__cxx11::to_string(local_2b0,0xe1);
    std::operator+(local_230,local_250);
    std::operator+(local_210,(char *)local_230);
    std::operator+(local_1f0,local_210);
    std::operator+(local_1d0,(char *)local_1f0);
    std::operator+(local_1b0,(char *)local_1d0);
    std::operator+(local_190,(char *)local_1b0);
    std::__cxx11::string::~string((string *)local_1b0);
    std::__cxx11::string::~string((string *)local_1d0);
    std::__cxx11::string::~string((string *)local_1f0);
    std::__cxx11::string::~string((string *)local_210);
    std::__cxx11::string::~string((string *)local_230);
    std::__cxx11::string::~string((string *)local_2b0);
    std::__cxx11::string::~string((string *)local_250);
    std::__cxx11::string::~string(local_270);
    std::__cxx11::string::~string((string *)local_290);
    readfile_abi_cxx11_((char *)local_2f0);
    std::operator+(local_2d0,local_190);
    vp = (char *)std::__cxx11::string::c_str();
    readfile_abi_cxx11_((char *)local_310);
    fp = (char *)std::__cxx11::string::c_str();
    dVar4 = (data_t)s_loadProgram(vp,fp,&pcStack_128,6);
    ((hierarchy.child.super__Vector_base<SphereTree,_std::allocator<SphereTree>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage)->bound).center.x = dVar4;
    std::__cxx11::string::~string(local_310);
    std::__cxx11::string::~string((string *)local_2d0);
    std::__cxx11::string::~string(local_2f0);
    if (((hierarchy.child.super__Vector_base<SphereTree,_std::allocator<SphereTree>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage)->bound).center.x == 0.0) {
      puVar5 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar5 = "Error loading mesh shader";
      __cxa_throw(puVar5,&char_const*::typeinfo,0);
    }
    dVar4 = (data_t)(*glad_glGetUniformLocation)
                              ((GLuint)((hierarchy.child.
                                         super__Vector_base<SphereTree,_std::allocator<SphereTree>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage)->bound)
                                       .center.x,"u_view");
    ((hierarchy.child.super__Vector_base<SphereTree,_std::allocator<SphereTree>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage)->bound).center.y = dVar4;
    dVar4 = (data_t)(*glad_glGetUniformLocation)
                              ((GLuint)((hierarchy.child.
                                         super__Vector_base<SphereTree,_std::allocator<SphereTree>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage)->bound)
                                       .center.x,"u_projection");
    ((hierarchy.child.super__Vector_base<SphereTree,_std::allocator<SphereTree>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage)->bound).center.z = dVar4;
    std::__cxx11::string::~string((string *)local_190);
    std::__cxx11::string::~string((string *)&i_2);
    SphereTree::~SphereTree((SphereTree *)local_38);
    return;
  }
  __assert_fail("buffer",
                "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/main.cpp"
                ,0xbd,"void initScene(scene_t *)");
}

Assistant:

static void initScene(scene_t *scene)
{
	SphereTree hierarchy = load_sphere_hierarchy(sphere_file);
	buildLHcubemap(sh_light_file);
	loadlut(3, scene->mesh.max_magn);
	build_sh_lut();
	scene->mesh.gammasize = upload_gamma(shorder);
	scene->mesh.sqrgammasize = upload_sqrgamma(shorder);
	console.log("gamma size:", scene->mesh.gammasize);
	console.log("sqrgamma size:", scene->mesh.sqrgammasize);

	// mesh
	console.log("loading scene...");
	yo_scene *yo = yo_load_obj(obj_file, true, false);
	if (!yo || !yo->nshapes)
		throw "Error loading obj file";
	console.log(yo->nshapes, "shapes");

	scene->mesh.vertices = 0;
	for (int i = 0; i < yo->nshapes; i++)
		scene->mesh.vertices += yo->shapes[i].nelems * 3;

	// load model texture
	upload_albedo_map(yo->nshapes, texture_file);

	// alloc host space for attributes
	m_vec3 *positions = (m_vec3*)calloc(scene->mesh.vertices, sizeof(m_vec3));
	m_vec2 *texcoords = (m_vec2*)calloc(scene->mesh.vertices, sizeof(m_vec2));
	m_vec3 *normals   = (m_vec3*)calloc(scene->mesh.vertices, sizeof(m_vec3));
	int *objids       = (int*)calloc(scene->mesh.vertices, sizeof(int));
	int *clusterids   = (int*)calloc(scene->mesh.vertices, sizeof(int));
	int *sphcnt   = (int*)calloc(scene->mesh.vertices, sizeof(int));
	// Note: LH isn't uploaded as vertex attribute
	float *LH = (float*)calloc(scene->mesh.vertices, N_COEFFS * sizeof(float));
	// total size of each attribute
	size_t positionsSize  = scene->mesh.vertices * sizeof(m_vec3);
	size_t texcoordsSize  = scene->mesh.vertices * sizeof(m_vec2);
	size_t normalsSize    = scene->mesh.vertices * sizeof(m_vec3);
	size_t objidsSize     = scene->mesh.vertices * sizeof(int);
	size_t clusteridsSize = scene->mesh.vertices * sizeof(int);
	size_t sphcntSize     = scene->mesh.vertices * sizeof(int);
	size_t LHSize         = scene->mesh.vertices * N_COEFFS * sizeof(float);

	// fill positions & normals from scene
	int n = 0;
	for (int i = 0; i < yo->nshapes; i++)
	{
		yo_shape *shape = yo->shapes + i;
		if (enable_texture[i] && !shape->texcoord)
			console.error("Shape",i,"is texture-enabled but has no texcoord");
		for (int j = 0; j < shape->nelems * 3; j++)
		{
			positions[n + j] = *(m_vec3*)&shape->pos[shape->elem[j] * 3];
			normals[n + j] = *(m_vec3*)&shape->norm[shape->elem[j] * 3];
			if (enable_texture[i])
				texcoords[n + j] = *(m_vec2*)&shape->texcoord[shape->elem[j] * 2];
			else
				texcoords[n + j] = m_vec2{-1,-1};
			objids[n + j] = i;
		}
		n += shape->nelems * 3;
	}
	yo_free_scene(yo);
	// cluster receiver
	cluster_points(scene->mesh.vertices, reinterpret_cast<vec3f*>(positions), clusterids);
	cluster_preprocess(scene->mesh.vertices, reinterpret_cast<vec3f*>(positions), clusterids, hierarchy, sphcnt);
	// preprocess lighting
	if (obj_light_enabled)
		calculateLH(scene->mesh.vertices, reinterpret_cast<vec3f*>(positions), reinterpret_cast<vec3f*>(normals), LH, obj_light_file);
	else
		memset(LH, 0, LHSize);
	// because openGL doesn't support array as attribute, we upload it as texture
	uploadLH(scene->mesh.vertices, LH);

	console.log("renderer initializing...");
	// upload geometry to opengl
	glGenVertexArrays(1, &scene->mesh.vao);
	glBindVertexArray(scene->mesh.vao);
	// upload attribute data
	glGenBuffers(1, &scene->mesh.vbo);
	glBindBuffer(GL_ARRAY_BUFFER, scene->mesh.vbo);
	glBufferData(GL_ARRAY_BUFFER, positionsSize + texcoordsSize + normalsSize + objidsSize + clusteridsSize + sphcntSize, NULL, GL_STATIC_DRAW);
	unsigned char *buffer = (unsigned char*)glMapBuffer(GL_ARRAY_BUFFER, GL_WRITE_ONLY);
	assert(buffer);
	memcpy(buffer, positions, positionsSize);
	memcpy(buffer + positionsSize, texcoords, texcoordsSize);
	memcpy(buffer + positionsSize + texcoordsSize, normals, normalsSize);
	memcpy(buffer + positionsSize + texcoordsSize + normalsSize, objids, objidsSize);
	memcpy(buffer + positionsSize + texcoordsSize + normalsSize + objidsSize, clusterids, clusteridsSize);
	memcpy(buffer + positionsSize + texcoordsSize + normalsSize + objidsSize + clusteridsSize, sphcnt, sphcntSize);
	glUnmapBuffer(GL_ARRAY_BUFFER);

	// set attribute pointers
	glEnableVertexAttribArray(0);
	glVertexAttribPointer(0, 3, GL_FLOAT, GL_FALSE, 0, (void*)0);
	glEnableVertexAttribArray(1);
	glVertexAttribPointer(1, 2, GL_FLOAT, GL_FALSE, 0, (void*)positionsSize);
	glEnableVertexAttribArray(2);
	glVertexAttribPointer(2, 3, GL_FLOAT, GL_FALSE, 0, (void*)(positionsSize + texcoordsSize));
	glEnableVertexAttribArray(3);
	glVertexAttribIPointer(3, 1, GL_INT, 0, (void*)(positionsSize + texcoordsSize + normalsSize));
	glEnableVertexAttribArray(4);
	glVertexAttribIPointer(4, 1, GL_INT, 0, (void*)(positionsSize + texcoordsSize + normalsSize + objidsSize));
	glEnableVertexAttribArray(5);
	glVertexAttribIPointer(5, 1, GL_INT, 0, (void*)(positionsSize + texcoordsSize + normalsSize + objidsSize + clusteridsSize));

	// free host space
	free(positions);
	free(normals);
	free(objids);
	free(clusterids);
	free(sphcnt);
	free(LH);

	const char *attribs[] =
	{
		"a_position",
		"a_texcoord",
		"a_normal",
		"a_objid",
		"a_clusterid",
		"a_sphcnt"
	};
	std::string N_ZEROS = "0";
	for (int i=1; i<N_COEFFS; ++i)
		N_ZEROS = N_ZEROS + ",0";
	std::string vert_head = "#version 410 core\n"
	"#define sh_order " + std::to_string(shorder) + "\n"
	"#define N " + std::to_string(shorder * shorder) + "\n"
	"#define N_ZEROS " + N_ZEROS + "\n"
	"#define SHEXP_METHOD " + SHEXP_METHOD + "\n";
	scene->mesh.program = s_loadProgram((vert_head + readfile(vert_shader_path)).c_str(), readfile(frag_shader_path).c_str(), attribs, 6);
	if (!scene->mesh.program)
		throw "Error loading mesh shader";
	scene->mesh.u_view = glGetUniformLocation(scene->mesh.program, "u_view");
	scene->mesh.u_projection = glGetUniformLocation(scene->mesh.program, "u_projection");
}